

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O3

int ref_singleton(saucy *s,coloring *c,int *adj,int *edg,int cf)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int *piVar4;
  
  lVar3 = (long)c->lab[cf];
  iVar2 = adj[lVar3];
  iVar1 = adj[lVar3 + 1];
  if (iVar2 != iVar1) {
    piVar4 = edg + iVar2;
    do {
      if (c->clen[c->cfront[*piVar4]] != 0) {
        move_to_back(s,c,*piVar4);
        iVar1 = adj[lVar3 + 1];
      }
      piVar4 = piVar4 + 1;
      iVar2 = iVar2 + 1;
    } while (iVar2 != iVar1);
  }
  iVar2 = refine_cell(s,c,ref_single_cell);
  return iVar2;
}

Assistant:

static int
ref_singleton(struct saucy *s, struct coloring *c,
    const int *adj, const int *edg, int cf)
{
    int i, k = c->lab[cf];

    /* Find the cells we're connected to, and mark our neighbors */
    for (i = adj[k]; i != adj[k+1]; ++i) {
        data_mark(s, c, edg[i]);
    }

    /* Refine the cells we're connected to */
    return refine_cell(s, c, ref_single_cell);
}